

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c82961::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  void *in_RDI;
  
  ~PostprocFiltersTestLarge_MD5Match_Test((PostprocFiltersTestLarge_MD5Match_Test *)0x8c77a8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }